

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# e_aegis128l.cc
# Opt level: O2

int aead_aegis_128l_open_gather
              (EVP_AEAD_CTX *ctx,uint8_t *out,uint8_t *nonce,size_t nonce_len,uint8_t *in,
              size_t in_len,uint8_t *in_tag,size_t in_tag_len,uint8_t *ad,size_t ad_len)

{
  int iVar1;
  int line;
  ulong uVar2;
  uint local_150;
  uint uStack_14c;
  uint uStack_148;
  uint uStack_144;
  uint local_140;
  uint uStack_13c;
  uint uStack_138;
  uint uStack_134;
  uint8_t local_130 [16];
  uint8_t local_120 [32];
  uint local_100;
  uint uStack_fc;
  uint uStack_f8;
  uint uStack_f4;
  uint local_c0;
  uint uStack_bc;
  uint uStack_b8;
  uint uStack_b4;
  
  if (nonce_len < 0x11) {
    if (ctx->tag_len == in_tag_len) {
      aegis_128l_state_init((ctx->state).opaque,nonce,nonce_len,(aes_block_t *)&local_100);
      for (uVar2 = 0x20; uVar2 <= ad_len; uVar2 = uVar2 + 0x20) {
        aead_aegis_128l_enc((uint8_t *)&local_150,ad,(aes_block_t *)&local_100);
        ad = ad + 0x20;
      }
      uVar2 = ad_len & 0x1f;
      if (uVar2 != 0) {
        memset(local_120 + uVar2,0,0x20 - uVar2);
        memcpy(local_120,ad,uVar2);
        aead_aegis_128l_enc((uint8_t *)&local_150,local_120,(aes_block_t *)&local_100);
      }
      for (uVar2 = 0x20; uVar2 <= in_len; uVar2 = uVar2 + 0x20) {
        aead_aegis_128l_dec(out,in,(aes_block_t *)&local_100);
        in = in + 0x20;
        out = out + 0x20;
      }
      uVar2 = in_len & 0x1f;
      if (uVar2 != 0) {
        memset((void *)((long)&local_150 + uVar2),0,0x20 - uVar2);
        memcpy(&local_150,in,uVar2);
        aead_aegis_128l_dec((uint8_t *)&local_150,(uint8_t *)&local_150,(aes_block_t *)&local_100);
        memcpy(out,&local_150,uVar2);
        memset(&local_150,0,uVar2);
        local_100 = local_150 ^ local_100;
        uStack_fc = uStack_14c ^ uStack_fc;
        uStack_f8 = uStack_148 ^ uStack_f8;
        uStack_f4 = uStack_144 ^ uStack_f4;
        local_c0 = local_140 ^ local_c0;
        uStack_bc = uStack_13c ^ uStack_bc;
        uStack_b8 = uStack_138 ^ uStack_b8;
        uStack_b4 = uStack_134 ^ uStack_b4;
      }
      aead_aegis_128l_tag(local_130,ad_len,in_len,(aes_block_t *)&local_100);
      iVar1 = CRYPTO_memcmp(local_130,in_tag,in_tag_len);
      if (iVar1 == 0) {
        return 1;
      }
      iVar1 = 0x65;
      line = 0x161;
    }
    else {
      iVar1 = 0x65;
      line = 0x141;
    }
  }
  else {
    iVar1 = 0x79;
    line = 0x13d;
  }
  ERR_put_error(0x1e,0,iVar1,
                "/workspace/llm4binary/github/license_all_cmakelists_25/jedisct1[P]boringssl/crypto/cipher/e_aegis128l.cc"
                ,line);
  return 0;
}

Assistant:

static int aead_aegis_128l_open_gather(const EVP_AEAD_CTX *ctx, uint8_t *out,
                                       const uint8_t *nonce, size_t nonce_len,
                                       const uint8_t *in, size_t in_len,
                                       const uint8_t *in_tag, size_t in_tag_len,
                                       const uint8_t *ad, size_t ad_len) {
  const struct aead_aegis_128l_ctx *aegis_ctx =
      (struct aead_aegis_128l_ctx *)&ctx->state;

  return aegis_128l_open_gather(aegis_ctx->key, out, nonce, nonce_len, in,
                                in_len, in_tag, in_tag_len, ad, ad_len,
                                ctx->tag_len);
}